

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O1

double computeObjectiveValue(HighsLp *lp,HighsSolution *solution)

{
  long lVar1;
  double dVar2;
  
  if ((long)lp->num_col_ < 1) {
    dVar2 = 0.0;
  }
  else {
    dVar2 = 0.0;
    lVar1 = 0;
    do {
      dVar2 = dVar2 + (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar1] *
                      (solution->col_value).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar1];
      lVar1 = lVar1 + 1;
    } while (lp->num_col_ != lVar1);
  }
  return dVar2 + lp->offset_;
}

Assistant:

double computeObjectiveValue(const HighsLp& lp, const HighsSolution& solution) {
  double objective_value = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
    objective_value += lp.col_cost_[iCol] * solution.col_value[iCol];
  objective_value += lp.offset_;
  return objective_value;
}